

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int fill_cmd_string(nt_opts *opts,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  ushort **ppuVar6;
  int iVar7;
  char *pcVar8;
  char *__s;
  long lVar9;
  ulong uVar10;
  char *local_58;
  int local_48;
  
  __s = opts->command;
  iVar3 = sprintf(__s,"\n  command: %s",*argv);
  local_58 = opts->command + iVar3;
  iVar3 = 0x800 - iVar3;
  lVar9 = 1;
  iVar7 = 0;
  do {
    if (argc <= lVar9) {
      if (1 < g_debug) {
        local_48 = (int)__s;
        fprintf(_stderr,"+d filled command string, %d args, %d bytes\n",(ulong)(uint)argc,
                (ulong)(uint)((int)local_58 - local_48));
        if (2 < g_debug) {
          fprintf(_stderr,"%s\n",__s);
        }
      }
      return 0;
    }
    if (iVar7 == 0) {
      pcVar2 = argv[lVar9];
      sVar5 = strlen(pcVar2);
      iVar7 = (int)sVar5;
      if (iVar3 <= iVar7 + 3) {
        fwrite("FCS: no space remaining for command, continuing...\n",0x33,1,_stderr);
        return 1;
      }
      if (iVar7 < 2) {
        iVar7 = 1;
      }
      uVar10 = 0;
      do {
        if (iVar7 - 1 == uVar10) {
          pcVar8 = " %s";
          goto LAB_00109ade;
        }
        ppuVar6 = __ctype_b_loc();
        pcVar8 = pcVar2 + uVar10;
        uVar10 = uVar10 + 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)*pcVar8 * 2 + 1) & 0x20) == 0);
      pcVar8 = " \'%s\'";
LAB_00109ade:
      iVar4 = sprintf(local_58,pcVar8,pcVar2);
      pcVar2 = argv[lVar9 + -1];
      iVar7 = 0;
      if ((((*pcVar2 == '-') && (pcVar2[1] == 'i')) && (pcVar2[2] == 'n')) &&
         (iVar1 = (opts->infiles).len, iVar7 = iVar1 + -2, iVar1 < 5)) {
        iVar7 = 0;
      }
      iVar3 = iVar3 - iVar4;
      local_58 = local_58 + iVar4;
    }
    else {
      iVar7 = iVar7 + -1;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

int fill_cmd_string( nt_opts * opts, int argc, char * argv[])
{
   char * cp;
   int    len, remain = NT_CMD_LEN;  /* NT_CMD_LEN is max command len */
   int    c, ac;
   int    has_space;  /* arguments containing space must be quoted */
   int    skip = 0;   /* counter to skip some of the arguments     */

   /* get the first argument separately */
   len = sprintf( opts->command, "\n  command: %s", argv[0] );
   cp = opts->command + len;
   remain -= len;

   /* get the rest, with special attention to input files */
   for( ac = 1; ac < argc; ac++ )
   {
      if( skip ){ skip--;  continue; }  /* then skip these arguments */

      len = strlen(argv[ac]);
      if( len + 3 >= remain ) {  /* extra 3 for space and possible '' */
         fprintf(stderr,"FCS: no space remaining for command, continuing...\n");
         return 1;
      }

      /* put the argument in, possibly with '' */

      has_space = 0;
      for( c = 0; c < len-1; c++ )
         if( isspace(argv[ac][c]) ){ has_space = 1; break; }
      if( has_space ) len = sprintf(cp, " '%s'", argv[ac]);
      else            len = sprintf(cp, " %s",   argv[ac]);

      remain -= len;

      /* infiles is okay, but after the *next* argument, we may skip files */
      /* (danger, will robinson!  hack alert!) */
      if( !strncmp(argv[ac-1],"-infiles",3) )
      {
         /* if more than 4 (just to be arbitrary) input files,
            include only the first and last */
         if( opts->infiles.len > 4 )
            skip = opts->infiles.len - 2;
      }

      cp += len;
   }

   if( g_debug > 1 ){
      fprintf(stderr,"+d filled command string, %d args, %d bytes\n",
              argc, (int)(cp - opts->command));
      if( g_debug > 2 ) fprintf(stderr,"%s\n", opts->command);
   }

   return 0;
}